

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_debug.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
phmap::priv::GetHashtableDebugNumProbesHistogram<phmap::priv::(anonymous_namespace)::IntTable>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IntTable *container)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  uint uVar3;
  char cVar4;
  undefined1 uVar5;
  anon_union_8_1_a8a14541_for_iterator_1 aVar6;
  size_t hashval;
  long lVar7;
  long lVar8;
  ulong __new_size;
  uint uVar9;
  pointer puVar10;
  __m128i match;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  const_iterator it;
  probe_seq<16UL> local_58;
  iterator local_40;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
             ::begin(&container->
                      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                    );
  puVar10 = (pointer)0x0;
  do {
    pcVar2 = (container->
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
             ).ctrl_;
    if (local_40.ctrl_ ==
        pcVar2 + (container->
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 ).capacity_) {
      return __return_storage_ptr__;
    }
    if (pcVar2 == (ctrl_t *)0x0) {
      lVar7 = 0;
    }
    else {
      aVar6 = local_40.field_1;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *local_40.field_1.slot_;
      hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar11,8) +
                SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar11,0);
      raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ::probe(&local_58,
              &container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ,hashval);
      uVar5 = (undefined1)hashval;
      auVar11 = ZEXT416((CONCAT11(uVar5,uVar5) & 0xff7f) & 0xffff7fff);
      auVar11 = pshuflw(auVar11,auVar11,0);
      lVar7 = 0;
      while( true ) {
        pcVar1 = (container->
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 ).ctrl_ + local_58.offset_;
        cVar4 = pcVar1[0xf];
        cVar13 = auVar11[0];
        auVar14[0] = -(cVar13 == *pcVar1);
        cVar15 = auVar11[1];
        auVar14[1] = -(cVar15 == pcVar1[1]);
        cVar16 = auVar11[2];
        auVar14[2] = -(cVar16 == pcVar1[2]);
        cVar17 = auVar11[3];
        auVar14[3] = -(cVar17 == pcVar1[3]);
        auVar14[4] = -(cVar13 == pcVar1[4]);
        auVar14[5] = -(cVar15 == pcVar1[5]);
        auVar14[6] = -(cVar16 == pcVar1[6]);
        auVar14[7] = -(cVar17 == pcVar1[7]);
        auVar14[8] = -(cVar13 == pcVar1[8]);
        auVar14[9] = -(cVar15 == pcVar1[9]);
        auVar14[10] = -(cVar16 == pcVar1[10]);
        auVar14[0xb] = -(cVar17 == pcVar1[0xb]);
        auVar14[0xc] = -(cVar13 == pcVar1[0xc]);
        auVar14[0xd] = -(cVar15 == pcVar1[0xd]);
        auVar14[0xe] = -(cVar16 == pcVar1[0xe]);
        auVar14[0xf] = -(cVar17 == cVar4);
        for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(auVar14[0xf] >> 7) << 0xf); uVar9 != 0;
            uVar9 = uVar9 - 1 & uVar9) {
          uVar3 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          if (*aVar6.slot_ ==
              (container->
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ).slots_[uVar3 + local_58.offset_ & local_58.mask_]) goto LAB_00128d07;
          lVar7 = lVar7 + 1;
        }
        auVar12[0] = -(*pcVar1 == -0x80);
        auVar12[1] = -(pcVar1[1] == -0x80);
        auVar12[2] = -(pcVar1[2] == -0x80);
        auVar12[3] = -(pcVar1[3] == -0x80);
        auVar12[4] = -(pcVar1[4] == -0x80);
        auVar12[5] = -(pcVar1[5] == -0x80);
        auVar12[6] = -(pcVar1[6] == -0x80);
        auVar12[7] = -(pcVar1[7] == -0x80);
        auVar12[8] = -(pcVar1[8] == -0x80);
        auVar12[9] = -(pcVar1[9] == -0x80);
        auVar12[10] = -(pcVar1[10] == -0x80);
        auVar12[0xb] = -(pcVar1[0xb] == -0x80);
        auVar12[0xc] = -(pcVar1[0xc] == -0x80);
        auVar12[0xd] = -(pcVar1[0xd] == -0x80);
        auVar12[0xe] = -(pcVar1[0xe] == -0x80);
        auVar12[0xf] = -(cVar4 == -0x80);
        if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar4 == -0x80)
        break;
        lVar8 = local_58.offset_ + local_58.index_;
        local_58.index_ = local_58.index_ + 0x10;
        local_58.offset_ = lVar8 + 0x10U & local_58.mask_;
        lVar7 = lVar7 + 1;
      }
LAB_00128d07:
      puVar10 = (__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    __new_size = (long)(__return_storage_ptr__->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
    if (__new_size <= lVar7 + 1U) {
      __new_size = lVar7 + 1U;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,__new_size);
    puVar10 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar10[lVar7] = puVar10[lVar7] + 1;
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::iterator::operator++(&local_40);
  } while( true );
}

Assistant:

std::vector<size_t> GetHashtableDebugNumProbesHistogram(const C& container) {
  std::vector<size_t> v;
  for (auto it = container.begin(); it != container.end(); ++it) {
    size_t num_probes = GetHashtableDebugNumProbes(
        container,
        phmap::priv::hashtable_debug_internal::GetKey<C>(*it, 0));
    v.resize((std::max)(v.size(), num_probes + 1));
    v[num_probes]++;
  }
  return v;
}